

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall
NaStateSpaceModel::NaStateSpaceModel(NaStateSpaceModel *this,NaStateSpaceModel *orig)

{
  long in_RSI;
  undefined8 *in_RDI;
  NaUnit *in_stack_ffffffffffffffa8;
  NaUnit *in_stack_ffffffffffffffb0;
  NaVector *this_00;
  NaConfigPart *in_stack_ffffffffffffffb8;
  NaMatrix *rMatr;
  NaConfigPart *in_stack_ffffffffffffffc0;
  NaUnit *this_01;
  
  NaUnit::NaUnit(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  NaConfigPart::NaConfigPart(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR_PrintLog_00198598;
  in_RDI[4] = &PTR__NaStateSpaceModel_00198688;
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 0x40);
  *(undefined4 *)((long)in_RDI + 0x44) = *(undefined4 *)(in_RSI + 0x44);
  *(undefined4 *)(in_RDI + 9) = *(undefined4 *)(in_RSI + 0x48);
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffffc0,(NaMatrix *)in_stack_ffffffffffffffb8);
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffffc0,(NaMatrix *)in_stack_ffffffffffffffb8);
  this_01 = (NaUnit *)(in_RDI + 0x10);
  NaMatrix::NaMatrix((NaMatrix *)this_01,(NaMatrix *)in_stack_ffffffffffffffb8);
  rMatr = (NaMatrix *)(in_RDI + 0x13);
  NaMatrix::NaMatrix((NaMatrix *)this_01,rMatr);
  this_00 = (NaVector *)(in_RDI + 0x16);
  NaVector::NaVector(this_00,(NaVector *)in_stack_ffffffffffffffa8);
  NaVector::NaVector(this_00,(NaVector *)(in_RDI + 0x19));
  NaUnit::Assign(this_01,(uint)((ulong)rMatr >> 0x20),(uint)rMatr,(uint)((ulong)this_00 >> 0x20));
  return;
}

Assistant:

NaStateSpaceModel::NaStateSpaceModel (const NaStateSpaceModel& orig)
    : NaUnit(orig),
      A(orig.A), B(orig.B), C(orig.C), D(orig.D), x(orig.x), x0(orig.x0),
      n(orig.n), m(orig.m), k(orig.k),
      NaConfigPart(orig)
{
    Assign(k, m);
}